

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

void __thiscall Pyraminx::scramble(Pyraminx *this,int depth)

{
  result_type layer;
  Corner corner;
  Direction dir;
  Direction random_direction;
  Corner random_corner;
  int random_layer;
  int i;
  uniform_int_distribution<int> dir_dist;
  uniform_int_distribution<int> local_13a8;
  uniform_int_distribution<int> corner_layer_dist;
  random_device generator;
  int depth_local;
  Pyraminx *this_local;
  
  std::random_device::random_device((random_device *)&corner_layer_dist);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13a8,0,3);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&random_layer,0,1);
  for (random_corner = U; (int)random_corner < depth; random_corner = random_corner + L) {
    layer = std::uniform_int_distribution<int>::operator()
                      (&local_13a8,(random_device *)&corner_layer_dist);
    corner = std::uniform_int_distribution<int>::operator()
                       (&local_13a8,(random_device *)&corner_layer_dist);
    dir = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&random_layer,
                     (random_device *)&corner_layer_dist);
    turn_layer(this,corner,layer,dir);
  }
  std::random_device::~random_device((random_device *)&corner_layer_dist);
  return;
}

Assistant:

void Pyraminx::scramble(int depth){
    std::random_device generator;
    std::uniform_int_distribution<int> corner_layer_dist(0, 3);
    std::uniform_int_distribution<int> dir_dist(0, 1);

    // Some help here from zildjohn01, cc by-sa 
    // https://stackoverflow.com/questions/2999012/generating-random-enums
    // Tip is to use static_cast to castrandom int to an enum
    // That way I can randomly choose a corner and direction.
    for(int i = 0; i < depth; i++){
        int random_layer = corner_layer_dist(generator);
        Corner random_corner = static_cast<Corner>(corner_layer_dist(generator));
        Direction random_direction = static_cast<Direction>(dir_dist(generator));
        turn_layer(random_corner, random_layer, random_direction);
    }
}